

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLSetTargetStringAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,char *ptr
              )

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined4 in_ECX;
  undefined2 in_DX;
  undefined2 in_SI;
  long in_RDI;
  undefined4 in_R8D;
  char *in_R9;
  int success;
  int size;
  xnvCtrlSetStringAttributeReply rep;
  xnvCtrlSetStringAttributeReq *req;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffff98;
  undefined1 local_58 [8];
  int local_50;
  undefined1 *local_38;
  XExtDisplayInfo *local_30;
  char *local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined2 local_18;
  undefined2 local_14;
  long local_10;
  int local_4;
  
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_10 = in_RDI;
  local_14 = in_SI;
  local_18 = in_DX;
  local_30 = find_display(in_stack_ffffffffffffff98);
  if ((local_30 == (XExtDisplayInfo *)0x0) || (local_30->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else if ((local_30 == (XExtDisplayInfo *)0x0) || (local_30->codes == (XExtCodes *)0x0)) {
    XMissingExtension(local_10,nvctrl_extension_name);
    local_4 = 0;
  }
  else {
    sVar3 = strlen(local_28);
    iVar2 = (int)sVar3;
    iVar1 = iVar2 + 1;
    if (*(long *)(local_10 + 0x968) != 0) {
      (*(code *)**(undefined8 **)(local_10 + 0x968))(local_10);
    }
    local_38 = (undefined1 *)_XGetRequest(local_10,9,0x14);
    *local_38 = (char)local_30->codes->major_opcode;
    local_38[1] = 9;
    *(undefined2 *)(local_38 + 6) = local_14;
    *(undefined2 *)(local_38 + 4) = local_18;
    *(undefined4 *)(local_38 + 8) = local_1c;
    *(undefined4 *)(local_38 + 0xc) = local_20;
    *(short *)(local_38 + 2) = *(short *)(local_38 + 2) + (short)(iVar2 + 4 >> 2);
    *(int *)(local_38 + 0x10) = iVar1;
    if (*(ulong *)(local_10 + 0xb8) < (ulong)(*(long *)(local_10 + 0xb0) + (long)iVar1)) {
      _XSend(local_10,local_28,(long)iVar1);
    }
    else {
      memcpy(*(void **)(local_10 + 0xb0),local_28,(long)iVar1);
      *(long *)(local_10 + 0xb0) = *(long *)(local_10 + 0xb0) + (long)(int)(iVar2 + 4U & 0xfffffffc)
      ;
    }
    iVar2 = _XReply(local_10,local_58,0);
    if (iVar2 == 0) {
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = 0;
    }
    else {
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = local_50;
    }
  }
  return local_4;
}

Assistant:

Bool XNVCTRLSetTargetStringAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char *ptr
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetStringAttributeReq *req;
    xnvCtrlSetStringAttributeReply rep;
    int size;
    Bool success;
    
    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    size = strlen(ptr)+1;

    LockDisplay (dpy);
    GetReq (nvCtrlSetStringAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetStringAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->length += ((size + 3) & ~3) >> 2;
    req->num_bytes = size;
    Data(dpy, ptr, size);
    
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    UnlockDisplay (dpy);
    SyncHandle ();
    
    success = rep.flags;
    return success;
}